

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_WriteObjectRec(BCWriterState *s,JSValue obj)

{
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue obj_03;
  JSValue obj_04;
  JSValue obj_05;
  JSValue obj_06;
  JSValue obj_07;
  JSValue obj_08;
  BOOL BVar1;
  int iVar2;
  BCWriterState *s_00;
  uint in_EDX;
  BCWriterState *in_RSI;
  JSValueUnion in_RDI;
  int idx;
  int ret;
  JSObject *p_1;
  JSString *p;
  JSFloat64Union u;
  uint32_t tag;
  JSString *in_stack_ffffffffffffff68;
  uint8_t v_00;
  uint32_t v;
  JSRuntime *in_stack_ffffffffffffff70;
  BCWriterState *in_stack_ffffffffffffff78;
  JSValueUnion in_stack_ffffffffffffff80;
  JSContext *in_stack_ffffffffffffff88;
  JSValueUnion in_stack_ffffffffffffff90;
  BCWriterState *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  JSValueUnion in_stack_ffffffffffffffb8;
  int64_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  BCWriterState *pBVar3;
  
  BVar1 = js_check_stack_overflow(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  if (BVar1 != 0) {
    JS_ThrowStackOverflow((JSContext *)0x144313);
    return -1;
  }
  s_00 = (BCWriterState *)(ulong)(in_EDX + 7);
  v_00 = (uint8_t)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  switch(s_00) {
  case (BCWriterState *)0x0:
    bc_put_u8(s_00,v_00);
    JS_WriteString(s_00,in_stack_ffffffffffffff68);
    break;
  default:
    goto LAB_00144737;
  case (BCWriterState *)0x4:
    if ((*(int *)((long)in_RDI.ptr + 0x38) << 0x10) >> 0x18 != 0) {
      obj_04.tag._0_4_ = in_stack_ffffffffffffffa8;
      obj_04.u.ptr = (void *)in_stack_ffffffffffffffa0;
      obj_04.tag._4_4_ = in_stack_ffffffffffffffac;
      iVar2 = JS_WriteModule(in_stack_ffffffffffffff98,obj_04);
      goto joined_r0x0014472f;
    }
    goto LAB_00144737;
  case (BCWriterState *)0x5:
    if ((*(int *)((long)in_RDI.ptr + 0x38) << 0x10) >> 0x18 != 0) {
      obj_01.tag = (int64_t)in_stack_ffffffffffffff98;
      obj_01.u.ptr = in_stack_ffffffffffffff90.ptr;
      iVar2 = JS_WriteFunctionTag((BCWriterState *)in_stack_ffffffffffffff88,obj_01);
      goto joined_r0x0014472f;
    }
LAB_00144737:
    JS_ThrowInternalError(*in_RDI.ptr,"unsupported tag (%d)",(ulong)in_EDX);
    return -1;
  case (BCWriterState *)0x6:
    pBVar3 = in_RSI;
    if (*(int *)((long)in_RDI.ptr + 0x38) >> 0x18 == 0) {
      if ((*(byte *)((long)&in_RSI->ctx + 5) >> 6 & 1) != 0) {
        JS_ThrowTypeError(*in_RDI.ptr,"circular reference");
        return -1;
      }
      *(byte *)((long)&in_RSI->ctx + 5) = *(byte *)((long)&in_RSI->ctx + 5) & 0xbf | 0x40;
    }
    else {
      in_stack_ffffffffffffffa8 =
           js_object_list_find(in_stack_ffffffffffffff88,
                               (JSObjectList *)in_stack_ffffffffffffff80.ptr,
                               (JSObject *)in_stack_ffffffffffffff78);
      v = (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20);
      if (-1 < in_stack_ffffffffffffffa8) {
        bc_put_u8(s_00,(uint8_t)((ulong)in_stack_ffffffffffffff68 >> 0x38));
        bc_put_leb128(s_00,v);
        return 0;
      }
      iVar2 = js_object_list_add(in_stack_ffffffffffffff88,
                                 (JSObjectList *)in_stack_ffffffffffffff80.ptr,
                                 (JSObject *)in_stack_ffffffffffffff78);
      if (iVar2 != 0) {
        return -1;
      }
    }
    switch(*(undefined2 *)((long)&in_RSI->ctx + 6)) {
    case 1:
      obj_05.tag._0_4_ = in_stack_ffffffffffffffa8;
      obj_05.u.ptr = (void *)in_stack_ffffffffffffffa0;
      obj_05.tag._4_4_ = in_stack_ffffffffffffffac;
      iVar2 = JS_WriteObjectTag(in_stack_ffffffffffffff98,obj_05);
      break;
    case 2:
      obj_06.tag = in_stack_ffffffffffffffc0;
      obj_06.u.float64 = in_stack_ffffffffffffffb8.float64;
      iVar2 = JS_WriteArray(in_RSI,obj_06);
      break;
    default:
      if ((*(ushort *)((long)&in_RSI->ctx + 6) < 0x15) ||
         (0x1d < *(ushort *)((long)&in_RSI->ctx + 6))) {
        JS_ThrowTypeError(*in_RDI.ptr,"unsupported object class");
        iVar2 = -1;
      }
      else {
        obj_03.tag = (int64_t)in_stack_ffffffffffffff98;
        obj_03.u.ptr = in_stack_ffffffffffffff90.ptr;
        iVar2 = JS_WriteTypedArray((BCWriterState *)in_stack_ffffffffffffff88,obj_03);
      }
      break;
    case 4:
    case 5:
    case 6:
      bc_put_u8(s_00,'\0');
      obj_08.tag = (int64_t)pBVar3;
      obj_08.u.ptr = in_RDI.ptr;
      iVar2 = JS_WriteObjectRec((BCWriterState *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),obj_08);
      break;
    case 10:
      bc_put_u8(s_00,'\0');
      obj_07.tag = (int64_t)pBVar3;
      obj_07.u.ptr = in_RDI.ptr;
      iVar2 = JS_WriteObjectRec((BCWriterState *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),obj_07);
      break;
    case 0x13:
      obj_02.tag = (int64_t)in_stack_ffffffffffffff98;
      obj_02.u.ptr = in_stack_ffffffffffffff90.ptr;
      iVar2 = JS_WriteArrayBuffer((BCWriterState *)in_stack_ffffffffffffff88,obj_02);
      break;
    case 0x14:
      if ((*(int *)((long)in_RDI.ptr + 0x38) << 8) >> 0x18 == 0) goto LAB_00144737;
      obj_00.tag = (int64_t)in_stack_ffffffffffffff88;
      obj_00.u.ptr = in_stack_ffffffffffffff80.ptr;
      iVar2 = JS_WriteSharedArrayBuffer(in_stack_ffffffffffffff78,obj_00);
    }
    *(byte *)((long)&in_RSI->ctx + 5) = *(byte *)((long)&in_RSI->ctx + 5) & 0xbf;
joined_r0x0014472f:
    if (iVar2 != 0) {
      return -1;
    }
    return 0;
  case (BCWriterState *)0x7:
    bc_put_u8(s_00,v_00);
    bc_put_sleb128(s_00,(int32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    break;
  case (BCWriterState *)0x8:
    bc_put_u8(s_00,v_00);
    break;
  case (BCWriterState *)0x9:
    bc_put_u8(s_00,v_00);
    break;
  case (BCWriterState *)0xa:
    bc_put_u8(s_00,v_00);
    break;
  case (BCWriterState *)0xe:
    bc_put_u8(s_00,v_00);
    bc_put_u64(s_00,(uint64_t)in_stack_ffffffffffffff68);
  }
  return 0;
}

Assistant:

static int JS_WriteObjectRec(BCWriterState *s, JSValueConst obj)
{
    uint32_t tag;

    if (js_check_stack_overflow(s->ctx->rt, 0)) {
        JS_ThrowStackOverflow(s->ctx);
        return -1;
    }

    tag = JS_VALUE_GET_NORM_TAG(obj);
    switch(tag) {
    case JS_TAG_NULL:
        bc_put_u8(s, BC_TAG_NULL);
        break;
    case JS_TAG_UNDEFINED:
        bc_put_u8(s, BC_TAG_UNDEFINED);
        break;
    case JS_TAG_BOOL:
        bc_put_u8(s, BC_TAG_BOOL_FALSE + JS_VALUE_GET_INT(obj));
        break;
    case JS_TAG_INT:
        bc_put_u8(s, BC_TAG_INT32);
        bc_put_sleb128(s, JS_VALUE_GET_INT(obj));
        break;
    case JS_TAG_FLOAT64:
        {
            JSFloat64Union u;
            bc_put_u8(s, BC_TAG_FLOAT64);
            u.d = JS_VALUE_GET_FLOAT64(obj);
            bc_put_u64(s, u.u64);
        }
        break;
    case JS_TAG_STRING:
        {
            JSString *p = JS_VALUE_GET_STRING(obj);
            bc_put_u8(s, BC_TAG_STRING);
            JS_WriteString(s, p);
        }
        break;
    case JS_TAG_FUNCTION_BYTECODE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        if (JS_WriteFunctionTag(s, obj))
            goto fail;
        break;
    case JS_TAG_MODULE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        if (JS_WriteModule(s, obj))
            goto fail;
        break;
    case JS_TAG_OBJECT:
        {
            JSObject *p = JS_VALUE_GET_OBJ(obj);
            int ret, idx;
            
            if (s->allow_reference) {
                idx = js_object_list_find(s->ctx, &s->object_list, p);
                if (idx >= 0) {
                    bc_put_u8(s, BC_TAG_OBJECT_REFERENCE);
                    bc_put_leb128(s, idx);
                    break;
                } else {
                    if (js_object_list_add(s->ctx, &s->object_list, p))
                        goto fail;
                }
            } else {
                if (p->tmp_mark) {
                    JS_ThrowTypeError(s->ctx, "circular reference");
                    goto fail;
                }
                p->tmp_mark = 1;
            }
            switch(p->class_id) {
            case JS_CLASS_ARRAY:
                ret = JS_WriteArray(s, obj);
                break;
            case JS_CLASS_OBJECT:
                ret = JS_WriteObjectTag(s, obj);
                break;
            case JS_CLASS_ARRAY_BUFFER:
                ret = JS_WriteArrayBuffer(s, obj);
                break;
            case JS_CLASS_SHARED_ARRAY_BUFFER:
                if (!s->allow_sab)
                    goto invalid_tag;
                ret = JS_WriteSharedArrayBuffer(s, obj);
                break;
            case JS_CLASS_DATE:
                bc_put_u8(s, BC_TAG_DATE);
                ret = JS_WriteObjectRec(s, p->u.object_data);
                break;
            case JS_CLASS_NUMBER:
            case JS_CLASS_STRING:
            case JS_CLASS_BOOLEAN:
#ifdef CONFIG_BIGNUM
            case JS_CLASS_BIG_INT:
            case JS_CLASS_BIG_FLOAT:
            case JS_CLASS_BIG_DECIMAL:
#endif
                bc_put_u8(s, BC_TAG_OBJECT_VALUE);
                ret = JS_WriteObjectRec(s, p->u.object_data);
                break;
            default:
                if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                    p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                    ret = JS_WriteTypedArray(s, obj);
                } else {
                    JS_ThrowTypeError(s->ctx, "unsupported object class");
                    ret = -1;
                }
                break;
            }
            p->tmp_mark = 0;
            if (ret)
                goto fail;
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
    case JS_TAG_BIG_FLOAT:
    case JS_TAG_BIG_DECIMAL:
        if (JS_WriteBigNum(s, obj))
            goto fail;
        break;
#endif
    default:
    invalid_tag:
        JS_ThrowInternalError(s->ctx, "unsupported tag (%d)", tag);
        goto fail;
    }
    return 0;

 fail:
    return -1;
}